

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.hpp
# Opt level: O1

ostream * operator<<(ostream *os,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *rhs)

{
  pointer pbVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  pointer pbVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  pbVar1 = (rhs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (rhs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& rhs)
	{
		os << "[ ";
		for (const auto& x : rhs)
			os << x << " ";
		os << "]";
		return os;
	}